

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O2

void __thiscall NoiseSource::~NoiseSource(NoiseSource *this)

{
  Noise **ppNVar1;
  double **ppdVar2;
  int i;
  long lVar3;
  
  (this->super_StochasticProcess).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__NoiseSource_001562b8;
  (this->super_StochasticProcess).super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__NoiseSource_00156340;
  (this->super_StochasticProcess).super_Physical._vptr_Physical =
       (_func_int **)&PTR__NoiseSource_00156388;
  for (lVar3 = 0; ppNVar1 = this->aNoises, lVar3 < this->nNoises; lVar3 = lVar3 + 1) {
    if (ppNVar1[lVar3] != (Noise *)0x0) {
      (*(ppNVar1[lVar3]->super_StochasticVariable).super_StochasticProcess.super_Parametric.
        _vptr_Parametric[1])();
    }
  }
  if (ppNVar1 != (Noise **)0x0) {
    operator_delete__(ppNVar1);
  }
  for (lVar3 = 0; ppdVar2 = this->aA, lVar3 < this->nNoises; lVar3 = lVar3 + 1) {
    if (ppdVar2[lVar3] != (double *)0x0) {
      operator_delete__(ppdVar2[lVar3]);
    }
  }
  if (ppdVar2 != (double **)0x0) {
    operator_delete__(ppdVar2);
  }
  if (this->aOmega != (double *)0x0) {
    operator_delete__(this->aOmega);
  }
  RandN::~RandN((RandN *)this);
  StochasticProcess::~StochasticProcess(&this->super_StochasticProcess);
  return;
}

Assistant:

NoiseSource::~NoiseSource()
{
	// noises array
	for(int i=0; i<nNoises; ++i)
		if(aNoises[i])
			delete aNoises[i];
	delete[] aNoises;
	
	// mixing array
	for(int i=0; i<nNoises; i++)
		delete[] aA[i];
	delete[] aA;
	
	// omega array
	delete[] aOmega;
}